

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O1

bool __thiscall
stream::inno_lzma1_decompressor_impl::filter
          (inno_lzma1_decompressor_impl *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  uint uVar6;
  lzma_stream *plVar7;
  string *psVar8;
  lzma_options_lzma options;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  lzma_options_lzma local_a0;
  
  if ((this->super_lzma_decompressor_impl_base).stream == (void *)0x0) {
    while (sVar4 = this->nread, sVar4 != 5) {
      pcVar3 = *begin_in;
      if (pcVar3 == end_in) {
        return true;
      }
      *begin_in = pcVar3 + 1;
      cVar1 = *pcVar3;
      this->nread = sVar4 + 1;
      this->header[sVar4] = cVar1;
    }
    bVar2 = this->header[0];
    uVar6 = (uint)bVar2;
    if (0xe1 < uVar6) {
      psVar8 = (string *)__cxa_allocate_exception(0x28);
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char*>((string *)local_c0,"inno lzma1 property error","");
      std::ios_base::failure[abi:cxx11]::failure(psVar8);
      *(undefined ***)psVar8 = &PTR__failure_00173700;
      *(undefined4 *)(psVar8 + 0x20) = 7;
      __cxa_throw(psVar8,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    local_a0.pb = uVar6 / 0x2d;
    local_a0.lp = (uint32_t)((ulong)((uint)bVar2 + (uVar6 / 0x2d) * -0x2d) * 0x1c71c71d >> 0x20);
    local_a0.lc = (uint)bVar2 + (uVar6 / 9) * -9;
    local_a0.dict_size = *(uint32_t *)(this->header + 1);
    plVar7 = init_raw_lzma_stream(0x4000000000000001,&local_a0);
    (this->super_lzma_decompressor_impl_base).stream = plVar7;
  }
  bVar5 = lzma_decompressor_impl_base::filter
                    (&this->super_lzma_decompressor_impl_base,begin_in,end_in,begin_out,end_out,
                     flush);
  return bVar5;
}

Assistant:

bool inno_lzma1_decompressor_impl::filter(const char * & begin_in, const char * end_in,
                                          char * & begin_out, char * end_out, bool flush) {
	
	// Decode the header.
	if(!stream) {
		
		// Read enough bytes to decode the header.
		while(nread != 5) {
			if(begin_in == end_in) {
				return true;
			}
			header[nread++] = *begin_in++;
		}
		
		lzma_options_lzma options;
		
		boost::uint8_t properties = boost::uint8_t(header[0]);
		if(properties > (9 * 5 * 5)) {
			throw lzma_error("inno lzma1 property error", LZMA_FORMAT_ERROR);
		}
		options.pb = boost::uint32_t(properties / (9 * 5));
		options.lp = boost::uint32_t((properties % (9 * 5)) / 9);
		options.lc = boost::uint32_t(properties % 9);
		
		options.dict_size = util::little_endian::load<boost::uint32_t>(header + 1);
		
		stream = init_raw_lzma_stream(LZMA_FILTER_LZMA1, options);
	}
	
	return lzma_decompressor_impl_base::filter(begin_in, end_in, begin_out, end_out, flush);
}